

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eltcalc.cpp
# Opt level: O0

void eltcalc::setinitdone(int processid)

{
  ostream *poVar1;
  string local_1b8 [48];
  ostringstream local_188 [8];
  ostringstream s;
  int processid_local;
  
  if (processid != 0) {
    std::__cxx11::ostringstream::ostringstream(local_188);
    poVar1 = std::operator<<((ostream *)local_188,"work/sema");
    poVar1 = std::operator<<(poVar1,"_elt/");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,processid);
    std::operator<<(poVar1,".id");
    std::__cxx11::ostringstream::str();
    touch(local_1b8);
    std::__cxx11::string::~string((string *)local_1b8);
    std::__cxx11::ostringstream::~ostringstream(local_188);
  }
  return;
}

Assistant:

void setinitdone(int processid)
	{
		if (processid) {
			std::ostringstream s;
			s << SEMA_DIR_PREFIX << "_elt/" << processid << ".id";
			touch(s.str());
		}
	}